

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O1

void HBLAS2::hblas2_gemv_square_LDSame<HAXX::quaternion<double>,double,(char)78>(void)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  quaternion<double> ALPHA_00;
  pointer pqVar15;
  quaternion<double> *__cur;
  quaternion<double> *A;
  quaternion<double> *X;
  ostream *poVar16;
  basic_ostream<char,_std::char_traits<char>_> *pbVar17;
  quaternion<double> *x;
  long lVar18;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  quaternion<double> *pqVar19;
  undefined1 auVar20 [32];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar21 [32];
  double dVar22;
  double dVar23;
  undefined1 auVar26 [16];
  double dVar24;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [32];
  undefined1 auVar29 [16];
  double dVar25;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  quaternion<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  stringstream ss;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_318;
  quaternion<double> local_2f8;
  undefined **local_2d8;
  undefined8 uStack_2d0;
  undefined8 *puStack_2c8;
  char **ppcStack_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [32];
  undefined1 local_278 [32];
  double local_250;
  quaternion<double> local_248;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_228;
  undefined1 local_210 [8];
  undefined8 local_208;
  shared_count sStack_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar45 [32];
  undefined1 auVar85 [32];
  undefined1 auVar89 [32];
  
  A = (quaternion<double> *)operator_new(320000);
  memset(A,0,320000);
  X = (quaternion<double> *)operator_new(0xc80);
  memset(X,0,0xc80);
  local_318.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0xc80);
  pqVar19 = local_318.
            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 100;
  local_318.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_318.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pqVar19;
  memset(local_318.
         super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start,0,0xc80);
  lVar18 = 0x18;
  local_318.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pqVar19;
  do {
    local_2d8 = (undefined **)
                std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&gen);
    dVar2 = _ZL3dis_1;
    dVar24 = _ZL3dis_0;
    dVar22 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar25 = _ZL3dis_0;
    local_278._0_8_ = _ZL3dis_1;
    dVar23 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar1 = _ZL3dis_0;
    local_298._0_8_ = dVar23;
    local_2b8._0_8_ = _ZL3dis_1;
    auVar31._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    pqVar15 = local_318.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    auVar31._8_56_ = extraout_var;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar24;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_2d8;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar2 - dVar24;
    auVar3 = vfmadd132sd_fma(auVar35,auVar48,auVar3);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = dVar25;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = dVar22;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = (double)local_278._0_8_ - dVar25;
    auVar79 = vfmadd132sd_fma(auVar49,auVar60,auVar79);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_298._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = (double)local_2b8._0_8_ - dVar1;
    auVar4 = vfmadd132sd_fma(auVar61,auVar69,auVar4);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = _ZL3dis_0;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = _ZL3dis_1 - _ZL3dis_0;
    auVar35 = vfmadd213sd_fma(auVar70,auVar31._0_16_,auVar80);
    *(long *)((long)X + lVar18 + -0x18) = auVar3._0_8_;
    *(long *)((long)X + lVar18 + -0x10) = auVar79._0_8_;
    *(long *)((long)X + lVar18 + -8) = auVar4._0_8_;
    *(long *)((long)&X->_M_real + lVar18) = auVar35._0_8_;
    lVar18 = lVar18 + 0x20;
    pqVar19 = local_318.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  } while (lVar18 != 0xc98);
  for (; pqVar19 != pqVar15; pqVar19 = pqVar19 + 1) {
    local_2d8 = (undefined **)
                std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&gen);
    dVar2 = _ZL3dis_1;
    dVar24 = _ZL3dis_0;
    dVar22 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar25 = _ZL3dis_0;
    local_278._0_8_ = _ZL3dis_1;
    dVar23 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar1 = _ZL3dis_0;
    local_298._0_8_ = dVar23;
    local_2b8._0_8_ = _ZL3dis_1;
    auVar32._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    auVar32._8_56_ = extraout_var_00;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar24;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_2d8;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar2 - dVar24;
    auVar3 = vfmadd132sd_fma(auVar36,auVar50,auVar5);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar25;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar22;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = (double)local_278._0_8_ - dVar25;
    auVar79 = vfmadd132sd_fma(auVar51,auVar62,auVar6);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar1;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_298._0_8_;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = (double)local_2b8._0_8_ - dVar1;
    auVar4 = vfmadd132sd_fma(auVar63,auVar71,auVar7);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = _ZL3dis_0;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = _ZL3dis_1 - _ZL3dis_0;
    auVar35 = vfmadd213sd_fma(auVar72,auVar32._0_16_,auVar81);
    pqVar19->_M_real = auVar3._0_8_;
    pqVar19->_M_imag_i = auVar79._0_8_;
    pqVar19->_M_imag_j = auVar4._0_8_;
    pqVar19->_M_imag_k = auVar35._0_8_;
  }
  lVar18 = 0x18;
  do {
    local_2d8 = (undefined **)
                std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&gen);
    dVar2 = _ZL3dis_1;
    dVar24 = _ZL3dis_0;
    dVar22 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar25 = _ZL3dis_0;
    local_278._0_8_ = _ZL3dis_1;
    dVar23 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar1 = _ZL3dis_0;
    local_298._0_8_ = dVar23;
    local_2b8._0_8_ = _ZL3dis_1;
    auVar33._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    auVar33._8_56_ = extraout_var_01;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar24;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_2d8;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar2 - dVar24;
    auVar3 = vfmadd132sd_fma(auVar37,auVar52,auVar8);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar25;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar22;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = (double)local_278._0_8_ - dVar25;
    auVar79 = vfmadd132sd_fma(auVar53,auVar64,auVar9);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar1;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_298._0_8_;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = (double)local_2b8._0_8_ - dVar1;
    auVar4 = vfmadd132sd_fma(auVar65,auVar73,auVar10);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = _ZL3dis_0;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = _ZL3dis_1 - _ZL3dis_0;
    auVar35 = vfmadd213sd_fma(auVar74,auVar33._0_16_,auVar82);
    *(long *)((long)A + lVar18 + -0x18) = auVar3._0_8_;
    *(long *)((long)A + lVar18 + -0x10) = auVar79._0_8_;
    *(long *)((long)A + lVar18 + -8) = auVar4._0_8_;
    *(long *)((long)&A->_M_real + lVar18) = auVar35._0_8_;
    lVar18 = lVar18 + 0x20;
  } while (lVar18 != 0x4e218);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&local_228,&local_318);
  local_2d8 = (undefined **)
              std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&gen);
  dVar2 = _ZL3dis_1;
  dVar24 = _ZL3dis_0;
  dVar22 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  dVar25 = _ZL3dis_0;
  local_278._0_8_ = _ZL3dis_1;
  dVar23 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  dVar1 = _ZL3dis_0;
  local_298._0_8_ = dVar23;
  local_2b8._0_8_ = _ZL3dis_1;
  auVar34._0_8_ =
       std::
       generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                 (&gen);
  auVar34._8_56_ = extraout_var_02;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar24;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_2d8;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar2 - dVar24;
  auVar3 = vfmadd132sd_fma(auVar38,auVar54,auVar11);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar25;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar22;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = (double)local_278._0_8_ - dVar25;
  auVar79 = vfmadd132sd_fma(auVar55,auVar66,auVar12);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_298._0_8_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = (double)local_2b8._0_8_ - dVar1;
  auVar4 = vfmadd132sd_fma(auVar67,auVar75,auVar13);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = _ZL3dis_0;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = _ZL3dis_1 - _ZL3dis_0;
  auVar35 = vfmadd213sd_fma(auVar76,auVar34._0_16_,auVar83);
  local_248._M_real = auVar3._0_8_;
  local_248._M_imag_i = auVar79._0_8_;
  local_248._M_imag_j = auVar4._0_8_;
  local_248._M_imag_k = auVar35._0_8_;
  local_2d8 = (undefined **)
              std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&gen);
  dVar25 = _ZL3dis_1;
  dVar24 = _ZL3dis_0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"hblas2_gemv_square_",0x13);
  local_2f8._M_real = (double)CONCAT71(local_2f8._M_real._1_7_,0x4e);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_2f8,1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Q",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"R",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"_LDSame",7);
  std::__cxx11::stringbuf::str();
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_2f8._M_real,
                       CONCAT71(local_2f8._M_imag_i._1_7_,local_2f8._M_imag_i._0_1_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," will use",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  std::ostream::put((char)poVar16);
  std::ostream::flush();
  if ((double *)local_2f8._M_real != &local_2f8._M_imag_j) {
    operator_delete((void *)local_2f8._M_real,(long)local_2f8._M_imag_j + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ALPHA = ",10);
  pbVar17 = HAXX::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_248);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar17 + -0x18) + (char)pbVar17);
  std::ostream::put((char)pbVar17);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  BETA = ",9);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar24;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_2d8;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar25 - dVar24;
  auVar3 = vfmadd132sd_fma(auVar26,auVar39,auVar14);
  dVar24 = auVar3._0_8_;
  poVar16 = std::ostream::_M_insert<double>(dVar24);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  std::ostream::put((char)poVar16);
  std::ostream::flush();
  ALPHA_00._M_imag_i = local_248._M_imag_i;
  ALPHA_00._M_real = local_248._M_real;
  ALPHA_00._M_imag_j = local_248._M_imag_j;
  ALPHA_00._M_imag_k = local_248._M_imag_k;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>,double>
            ('N',100,100,ALPHA_00,A,100,X,1,dVar24,
             local_318.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1);
  lVar18 = 0;
  do {
    HAXX::HBLAS_DOTUV<double>
              (&local_2f8,100,(quaternion<double> *)((long)&A->_M_real + lVar18),100,X,1);
    uStack_2d0 = CONCAT71(local_2f8._M_imag_i._1_7_,local_2f8._M_imag_i._0_1_);
    local_2d8 = (undefined **)local_2f8._M_real;
    puStack_2c8 = (undefined8 *)local_2f8._M_imag_j;
    ppcStack_2c0 = (char **)local_2f8._M_imag_k;
    local_1c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_1c0 = "";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x47,&local_1d8);
    pqVar15 = local_318.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar21._8_8_ = local_248._M_imag_i;
    auVar21._0_8_ = local_248._M_real;
    auVar21._16_8_ = local_248._M_imag_j;
    auVar21._24_8_ = local_248._M_imag_k;
    auVar78._8_8_ = uStack_2d0;
    auVar78._0_8_ = local_2d8;
    auVar78._16_8_ = puStack_2c8;
    auVar78._24_8_ = ppcStack_2c0;
    auVar20 = vpermpd_avx2(auVar78,0xe7);
    auVar79 = auVar78._16_16_;
    auVar44 = vpermpd_avx2(auVar21,0x9f);
    auVar3 = vshufpd_avx(auVar79,auVar79,1);
    auVar91._0_8_ = auVar3._0_8_ * auVar44._0_8_;
    auVar91._8_8_ = auVar3._8_8_ * auVar44._8_8_;
    auVar91._16_8_ = auVar20._0_8_ * auVar44._16_8_;
    auVar91._24_8_ = auVar20._8_8_ * auVar44._24_8_;
    auVar20._8_8_ = local_248._M_real;
    auVar20._0_8_ = local_248._M_real;
    auVar20._16_8_ = local_248._M_real;
    auVar20._24_8_ = local_248._M_real;
    auVar20 = vfmsub231pd_avx512vl(auVar91,auVar78,auVar20);
    dVar23 = dVar24 * *(double *)
                       ((long)&(local_228.
                                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar18);
    dVar25 = *(double *)
              ((long)&(local_228.
                       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_imag_i + lVar18);
    dVar1 = *(double *)
             ((long)&(local_228.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_imag_j + lVar18);
    dVar2 = *(double *)
             ((long)&(local_228.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_imag_k + lVar18);
    dVar22 = *(double *)
              ((long)&(local_318.
                       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar18);
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         *(ulong *)((long)&(local_318.
                            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_imag_i + lVar18);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar22 * dVar22;
    auVar3 = vfmadd231sd_fma(auVar27,auVar40,auVar40);
    auVar41._8_8_ = 0;
    auVar41._0_8_ =
         *(ulong *)((long)&(local_318.
                            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_imag_j + lVar18);
    auVar3 = vfmadd213sd_fma(auVar41,auVar41,auVar3);
    auVar28._8_8_ = 0;
    auVar28._0_8_ =
         *(ulong *)((long)&(local_318.
                            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_imag_k + lVar18);
    auVar3 = vfmadd213sd_fma(auVar28,auVar28,auVar3);
    if (auVar3._0_8_ < 0.0) {
      local_278 = ZEXT1632(auVar79);
      local_2b8 = auVar21;
      local_298 = auVar20;
      local_250 = dVar23;
      dVar22 = sqrt(auVar3._0_8_);
      auVar78._8_8_ = uStack_2d0;
      auVar78._0_8_ = local_2d8;
      auVar78._16_8_ = puStack_2c8;
      auVar78._24_8_ = ppcStack_2c0;
      auVar21 = local_2b8;
      auVar20 = local_298;
      dVar23 = local_250;
      auVar79 = local_278._0_16_;
    }
    else {
      auVar3 = vsqrtsd_avx(auVar3,auVar3);
      dVar22 = auVar3._0_8_;
    }
    auVar91 = vpermpd_avx2(auVar78,0xe9);
    auVar44 = vshufpd_avx(auVar21,auVar21,0xb);
    auVar21 = vpermpd_avx2(auVar21,0x7a);
    auVar78 = vpermpd_avx2(auVar78,1);
    auVar57._0_8_ = auVar44._0_8_ * auVar78._0_8_;
    auVar57._8_8_ = auVar44._8_8_ * auVar78._8_8_;
    auVar57._16_8_ = auVar44._16_8_ * auVar78._16_8_;
    auVar57._24_8_ = auVar44._24_8_ * auVar78._24_8_;
    auVar44._16_16_ = auVar91._0_16_;
    auVar44._0_16_ = auVar79;
    auVar3 = vfmadd213pd_fma(auVar44,auVar21,auVar57);
    auVar42._0_8_ = auVar20._0_8_ + -auVar3._0_8_;
    auVar42._8_8_ = auVar20._8_8_ + auVar3._8_8_;
    auVar45._16_8_ = auVar20._16_8_ + 0.0;
    auVar45._0_16_ = auVar42;
    auVar45._24_8_ = auVar20._24_8_ + 0.0;
    dVar23 = dVar23 + auVar42._0_8_;
    auVar3 = vshufpd_avx(auVar42,auVar42,1);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar24 * dVar25 + auVar3._0_8_;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = dVar23;
    auVar79 = vunpcklpd_avx(auVar77,auVar56);
    dVar25 = dVar24 * dVar1 + auVar45._16_8_;
    auVar58._8_8_ = dVar25;
    auVar58._0_8_ = dVar25;
    auVar58._16_8_ = dVar25;
    auVar58._24_8_ = dVar25;
    auVar21 = vblendpd_avx(ZEXT1632(auVar79),auVar58,4);
    auVar3 = vshufpd_avx(auVar45._16_16_,auVar45._16_16_,1);
    dVar25 = dVar24 * dVar2 + auVar3._0_8_;
    auVar46._8_8_ = dVar25;
    auVar46._0_8_ = dVar25;
    auVar46._16_8_ = dVar25;
    auVar46._24_8_ = dVar25;
    auVar20 = vblendpd_avx(auVar21,auVar46,8);
    auVar84._0_8_ = (*(double *)((long)&pqVar15->_M_real + lVar18) / dVar22) / dVar22;
    auVar87._0_8_ = (-*(double *)((long)&pqVar15->_M_imag_i + lVar18) / dVar22) / dVar22;
    auVar87._8_8_ = 0x8000000000000000;
    auVar84._8_8_ = auVar84._0_8_;
    auVar85._16_8_ = auVar84._0_8_;
    auVar85._0_16_ = auVar84;
    auVar85._24_8_ = auVar84._0_8_;
    auVar3 = vunpcklpd_avx(auVar84,auVar87);
    auVar88._0_8_ = (-*(double *)((long)&pqVar15->_M_imag_j + lVar18) / dVar22) / dVar22;
    auVar88._8_8_ = auVar88._0_8_;
    auVar89._16_8_ = auVar88._0_8_;
    auVar89._0_16_ = auVar88;
    auVar89._24_8_ = auVar88._0_8_;
    auVar44 = vblendpd_avx(ZEXT1632(auVar3),auVar89,4);
    auVar30._0_8_ = (-*(double *)((long)&pqVar15->_M_imag_k + lVar18) / dVar22) / dVar22;
    auVar30._8_8_ = auVar30._0_8_;
    auVar30._16_8_ = auVar30._0_8_;
    auVar30._24_8_ = auVar30._0_8_;
    auVar44 = vblendpd_avx(auVar44,auVar30,8);
    auVar78 = vshufpd_avx(auVar20,auVar20,0xb);
    auVar3 = vunpckhpd_avx(auVar20._16_16_,auVar79);
    auVar68._8_8_ = auVar21._16_8_;
    auVar68._0_8_ = auVar21._16_8_;
    auVar68._16_16_ = auVar3;
    auVar3 = vunpcklpd_avx(auVar87,auVar84);
    auVar20 = vblendpd_avx(ZEXT1632(auVar3),auVar85,0xc);
    auVar3 = vunpcklpd_avx(auVar87,auVar88);
    auVar90._16_16_ = auVar3;
    auVar90._0_16_ = auVar44._16_16_;
    auVar86._0_8_ = auVar78._0_8_ * auVar20._0_8_;
    auVar86._8_8_ = auVar78._8_8_ * auVar20._8_8_;
    auVar86._16_8_ = auVar78._16_8_ * auVar20._16_8_;
    auVar86._24_8_ = auVar78._24_8_ * auVar20._24_8_;
    auVar3 = vfmadd231pd_fma(auVar86,auVar68,auVar90);
    auVar21 = vpermt2pd_avx512f(_DAT_002494e0,auVar21);
    auVar59._8_8_ = dVar23;
    auVar59._0_8_ = dVar23;
    auVar59._16_8_ = dVar23;
    auVar59._24_8_ = dVar23;
    auVar20 = vpermt2pd_avx512f(_DAT_00248800,ZEXT1632(auVar87));
    auVar47._0_8_ = auVar20._0_8_ * auVar21._0_8_;
    auVar47._8_8_ = auVar20._8_8_ * auVar21._8_8_;
    auVar47._16_8_ = auVar20._16_8_ * auVar21._16_8_;
    auVar47._24_8_ = auVar20._24_8_ * auVar21._24_8_;
    auVar79 = vfmsub231pd_fma(auVar47,auVar44,auVar59);
    auVar29._0_8_ = auVar79._0_8_ + -auVar3._0_8_;
    auVar29._8_8_ = auVar79._8_8_ + auVar3._8_8_;
    auVar3 = vshufpd_avx(auVar29,auVar29,1);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = (auVar29._0_8_ + -1.0) * (auVar29._0_8_ + -1.0);
    auVar3 = vfmadd213sd_fma(auVar3,auVar3,auVar43);
    auVar79 = vfmadd231sd_fma(auVar3,(undefined1  [16])0x0,(undefined1  [16])0x0);
    auVar3 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
    auVar3 = vfmadd213sd_fma(auVar3,auVar3,auVar79);
    if (auVar3._0_8_ < 0.0) {
      dVar25 = sqrt(auVar3._0_8_);
    }
    else {
      auVar3 = vsqrtsd_avx(auVar3,auVar3);
      dVar25 = auVar3._0_8_;
    }
    local_210[0] = dVar25 < 1e-12;
    local_208 = 0;
    sStack_200.pi_ = (sp_counted_base *)0x0;
    local_1e8 = "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )";
    local_1e0 = "";
    local_2f8._M_imag_i._0_1_ = 0;
    local_2f8._M_real = (double)&PTR__lazy_ostream_002698f0;
    local_2f8._M_imag_j = (double)&boost::unit_test::lazy_ostream::inst;
    local_2f8._M_imag_k = (double)&local_1e8;
    local_1f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_1f0 = "";
    boost::test_tools::tt_detail::report_assertion(local_210,&local_2f8,&local_1f8,0x47,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_200);
    lVar18 = lVar18 + 0x20;
  } while (lVar18 != 0xc80);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_228.
      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_318.
      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (quaternion<double> *)0x0) {
    operator_delete(local_318.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(X,0xc80);
  operator_delete(A,320000);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(hblas2_gemv_square_CQR_LDSame) {
  hblas2_gemv_square_LDSame<HAXX::quaternion<double>,double,'C'>(); 
}